

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

bool __thiscall CNode::IsManualOrFullOutboundConn(CNode *this)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  bool local_9;
  
  iVar1 = *(int *)(in_RDI + 0x244);
  if (iVar1 != 0) {
    if (iVar1 - 1U < 2) {
      local_9 = true;
      goto LAB_00235398;
    }
    if (2 < iVar1 - 3U) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.h"
                    ,0x319,"bool CNode::IsManualOrFullOutboundConn() const");
    }
  }
  local_9 = false;
LAB_00235398:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool IsManualOrFullOutboundConn() const
    {
        switch (m_conn_type) {
        case ConnectionType::INBOUND:
        case ConnectionType::FEELER:
        case ConnectionType::BLOCK_RELAY:
        case ConnectionType::ADDR_FETCH:
                return false;
        case ConnectionType::OUTBOUND_FULL_RELAY:
        case ConnectionType::MANUAL:
                return true;
        } // no default case, so the compiler can warn about missing cases

        assert(false);
    }